

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutex-posix.c
# Opt level: O2

PMutex * p_mutex_new(void)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)p_malloc0(0x28);
  if (__mutex == (pthread_mutex_t *)0x0) {
    __mutex = (pthread_mutex_t *)0x0;
    printf("** Error: %s **\n","PMutex::p_mutex_new: failed to allocate memory");
  }
  else {
    iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    if (iVar1 != 0) {
      printf("** Error: %s **\n","PMutex::p_mutex_new: pthread_mutex_init() failed");
      p_free(__mutex);
      __mutex = (pthread_mutex_t *)0x0;
    }
  }
  return (PMutex *)__mutex;
}

Assistant:

P_LIB_API PMutex *
p_mutex_new (void)
{
	PMutex *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PMutex))) == NULL)) {
		P_ERROR ("PMutex::p_mutex_new: failed to allocate memory");
		return NULL;
	}

	if (P_UNLIKELY (pthread_mutex_init (&ret->hdl, NULL) != 0)) {
		P_ERROR ("PMutex::p_mutex_new: pthread_mutex_init() failed");
		p_free (ret);
		return NULL;
	}

	return ret;
}